

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O3

istream * __thiscall nivalis::Plotter::import_binary_render_result(Plotter *this,istream *is)

{
  pointer pPVar1;
  pointer pDVar2;
  ulong uVar3;
  long lVar4;
  bool loss_detail_tmp;
  string func_error_tmp;
  bool local_50 [8];
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  std::istream::read((char *)is,(long)&local_48);
  std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::resize
            (&this->draw_buf,(size_type)local_48);
  pDVar2 = (this->draw_buf).
           super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->draw_buf).
      super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>.
      _M_impl.super__Vector_impl_data._M_finish != pDVar2) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      DrawBufferObject::from_bin((DrawBufferObject *)((long)(pDVar2->c).data + lVar4 + -0x20),is);
      uVar3 = uVar3 + 1;
      pDVar2 = (this->draw_buf).
               super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x80;
    } while (uVar3 < (ulong)((long)(this->draw_buf).
                                   super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2 >> 7));
  }
  std::istream::read((char *)is,(long)&local_48);
  std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::resize
            (&this->pt_markers,(size_type)local_48);
  pPVar1 = (this->pt_markers).
           super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->pt_markers).
      super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar1) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      std::istream::read((char *)is,(long)&pPVar1->x + lVar4);
      uVar3 = uVar3 + 1;
      pPVar1 = (this->pt_markers).
               super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x38;
    } while (uVar3 < (ulong)(((long)(this->pt_markers).
                                    super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 3)
                            * 0x6db6db6db6db6db7));
  }
  local_40 = 0;
  local_38 = 0;
  local_48 = &local_38;
  std::istream::read((char *)is,(long)local_50);
  std::__cxx11::string::resize((ulong)&local_48,local_50[0]);
  std::istream::read((char *)is,(long)local_48);
  std::istream::read((char *)is,(long)local_50);
  if (local_50[0] == true) {
    std::__cxx11::string::_M_assign((string *)&this->func_error);
  }
  else if (this->loss_detail == true) {
    (this->func_error)._M_string_length = 0;
    *(this->func_error)._M_dataplus._M_p = '\0';
  }
  this->loss_detail = local_50[0];
  this->require_update = true;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return is;
}

Assistant:

std::istream& Plotter::import_binary_render_result(std::istream& is) {
    util::resize_from_read_bin(is, draw_buf);
    for (size_t i = 0; i < draw_buf.size(); ++i) {
        draw_buf[i].from_bin(is);
    }
    util::resize_from_read_bin(is, pt_markers);
    for (size_t i = 0; i < pt_markers.size(); ++i) {
        util::read_bin(is, pt_markers[i]);
    }
    std::string func_error_tmp;
    util::resize_from_read_bin(is, func_error_tmp);
    is.read(&func_error_tmp[0], func_error_tmp.size());
    bool loss_detail_tmp;
    util::read_bin(is, loss_detail_tmp);
    if (loss_detail_tmp) {
        func_error = func_error_tmp;
    } else if (loss_detail) {
        func_error.clear();
    }
    loss_detail = loss_detail_tmp;
    require_update = true;
    return is;
}